

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O2

int xmlSchemaCompareDecimals(xmlSchemaValPtr x,xmlSchemaValPtr y)

{
  ushort uVar1;
  ushort uVar2;
  unsigned_long uVar3;
  xmlChar *pxVar4;
  xmlChar *pxVar5;
  xmlSchemaValPtr pxVar6;
  xmlChar *pxVar7;
  xmlChar *pxVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  xmlChar *pxVar14;
  uint uVar15;
  
  uVar1 = *(ushort *)((long)&x->value + 0x1c);
  if (((uVar1 & 1) == 0) ||
     ((((x->value).decimal.lo == 0 && ((x->value).decimal.mi == 0)) && ((x->value).decimal.hi == 0))
     )) {
    uVar2 = *(ushort *)((long)&y->value + 0x1c);
    iVar9 = 1;
    uVar12 = (uint)uVar2;
    if ((uVar2 & 1) != 0) {
      if ((y->value).decimal.lo != 0) {
        return 1;
      }
      if ((y->value).decimal.mi != 0) {
        return 1;
      }
      uVar12 = (uint)uVar2;
      if ((y->value).decimal.hi != 0) {
        return 1;
      }
    }
  }
  else {
    uVar2 = *(ushort *)((long)&y->value + 0x1c);
    uVar12 = (uint)uVar2;
    iVar9 = -1;
    if ((uVar2 & 1) == 0) {
      return -1;
    }
    if ((((y->value).decimal.lo == 0) && ((y->value).decimal.mi == 0)) &&
       ((y->value).decimal.hi == 0)) {
      return -1;
    }
  }
  iVar10 = (uint)(uVar1 >> 8) - (uVar1 >> 1 & 0x7f);
  iVar13 = (uVar12 >> 8) - (uVar12 >> 1 & 0x7f);
  if ((iVar10 == 1) && ((x->value).decimal.lo == 0)) {
    if (iVar13 == 1) {
      iVar9 = -iVar9;
      uVar3 = (y->value).decimal.lo;
LAB_001c5df6:
      if (uVar3 != 0) {
        return iVar9;
      }
      return 0;
    }
  }
  else {
    if ((iVar13 == 1) && ((y->value).decimal.lo == 0)) {
      if (iVar10 != 1) {
        return iVar9;
      }
      uVar3 = (x->value).decimal.lo;
      goto LAB_001c5df6;
    }
    if (iVar13 < iVar10) {
      return iVar9;
    }
    if (iVar13 <= iVar10) {
      iVar10 = (uint)(uVar1 >> 8) - (uVar12 >> 8);
      pxVar6 = x;
      if (iVar10 < 0) {
        iVar10 = -iVar10;
        iVar9 = -iVar9;
        pxVar6 = y;
        y = x;
      }
      uVar15 = iVar10 + 8;
      pxVar4 = (xmlChar *)(pxVar6->value).decimal.hi;
      pxVar5 = (pxVar6->value).qname.name;
      pxVar14 = (pxVar6->value).qname.uri;
      do {
        pxVar7 = pxVar14;
        pxVar8 = pxVar5;
        pxVar14 = pxVar4;
        uVar15 = uVar15 - 8;
        pxVar4 = (xmlChar *)0x0;
        pxVar5 = pxVar7;
      } while (8 < uVar15);
      for (; 0 < (int)uVar15; uVar15 = uVar15 - 1) {
        uVar11 = (ulong)pxVar7 % 10;
        pxVar7 = (xmlChar *)((ulong)(pxVar7 + ((ulong)pxVar14 % 10) * 100000000) / 10);
        pxVar8 = (xmlChar *)((ulong)(pxVar8 + uVar11 * 100000000) / 10);
        pxVar14 = (xmlChar *)((ulong)pxVar14 / 10);
      }
      pxVar4 = (xmlChar *)(y->value).decimal.hi;
      if (pxVar4 < pxVar14) {
        return iVar9;
      }
      if (pxVar14 == pxVar4) {
        pxVar4 = (xmlChar *)(y->value).decimal.mi;
        if (pxVar4 < pxVar7) {
          return iVar9;
        }
        if (pxVar7 == pxVar4) {
          pxVar4 = (xmlChar *)(y->value).decimal.lo;
          if (pxVar4 < pxVar8) {
            return iVar9;
          }
          if (pxVar8 == pxVar4) {
            if (0xff < (ushort)((ushort)uVar12 ^ uVar1)) {
              return iVar9;
            }
            return 0;
          }
        }
      }
    }
  }
  return -iVar9;
}

Assistant:

static int
xmlSchemaCompareDecimals(xmlSchemaValPtr x, xmlSchemaValPtr y)
{
    xmlSchemaValPtr swp;
    int order = 1, integx, integy, dlen;
    unsigned long hi, mi, lo;

    /*
     * First test: If x is -ve and not zero
     */
    if ((x->value.decimal.sign) &&
	((x->value.decimal.lo != 0) ||
	 (x->value.decimal.mi != 0) ||
	 (x->value.decimal.hi != 0))) {
	/*
	 * Then if y is -ve and not zero reverse the compare
	 */
	if ((y->value.decimal.sign) &&
	    ((y->value.decimal.lo != 0) ||
	     (y->value.decimal.mi != 0) ||
	     (y->value.decimal.hi != 0)))
	    order = -1;
	/*
	 * Otherwise (y >= 0) we have the answer
	 */
	else
	    return (-1);
    /*
     * If x is not -ve and y is -ve we have the answer
     */
    } else if ((y->value.decimal.sign) &&
	       ((y->value.decimal.lo != 0) ||
		(y->value.decimal.mi != 0) ||
		(y->value.decimal.hi != 0))) {
        return (1);
    }
    /*
     * If it's not simply determined by a difference in sign,
     * then we need to compare the actual values of the two nums.
     * To do this, we start by looking at the integral parts.
     * If the number of integral digits differ, then we have our
     * answer.
     */
    integx = x->value.decimal.total - x->value.decimal.frac;
    integy = y->value.decimal.total - y->value.decimal.frac;
    /*
    * NOTE: We changed the "total" for values like "0.1"
    *   (or "-0.1" or ".1") to be 1, which was 2 previously.
    *   Therefore the special case, when such values are
    *   compared with 0, needs to be handled separately;
    *   otherwise a zero would be recognized incorrectly as
    *   greater than those values. This has the nice side effect
    *   that we gain an overall optimized comparison with zeroes.
    * Note that a "0" has a "total" of 1 already.
    */
    if (integx == 1) {
	if (x->value.decimal.lo == 0) {
	    if (integy != 1)
		return -order;
	    else if (y->value.decimal.lo != 0)
		return -order;
	    else
		return(0);
	}
    }
    if (integy == 1) {
	if (y->value.decimal.lo == 0) {
	    if (integx != 1)
		return order;
	    else if (x->value.decimal.lo != 0)
		return order;
	    else
		return(0);
	}
    }

    if (integx > integy)
	return order;
    else if (integy > integx)
	return -order;

    /*
     * If the number of integral digits is the same for both numbers,
     * then things get a little more complicated.  We need to "normalize"
     * the numbers in order to properly compare them.  To do this, we
     * look at the total length of each number (length => number of
     * significant digits), and divide the "shorter" by 10 (decreasing
     * the length) until they are of equal length.
     */
    dlen = x->value.decimal.total - y->value.decimal.total;
    if (dlen < 0) {	/* y has more digits than x */
	swp = x;
	hi = y->value.decimal.hi;
	mi = y->value.decimal.mi;
	lo = y->value.decimal.lo;
	dlen = -dlen;
	order = -order;
    } else {		/* x has more digits than y */
	swp = y;
	hi = x->value.decimal.hi;
	mi = x->value.decimal.mi;
	lo = x->value.decimal.lo;
    }
    while (dlen > 8) {	/* in effect, right shift by 10**8 */
	lo = mi;
	mi = hi;
	hi = 0;
	dlen -= 8;
    }
    while (dlen > 0) {
	unsigned long rem1, rem2;
	rem1 = (hi % 10) * 100000000L;
	hi = hi / 10;
	rem2 = (mi % 10) * 100000000L;
	mi = (mi + rem1) / 10;
	lo = (lo + rem2) / 10;
	dlen--;
    }
    if (hi > swp->value.decimal.hi) {
	return order;
    } else if (hi == swp->value.decimal.hi) {
	if (mi > swp->value.decimal.mi) {
	    return order;
	} else if (mi == swp->value.decimal.mi) {
	    if (lo > swp->value.decimal.lo) {
		return order;
	    } else if (lo == swp->value.decimal.lo) {
		if (x->value.decimal.total == y->value.decimal.total) {
		    return 0;
		} else {
		    return order;
		}
	    }
	}
    }
    return -order;
}